

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O3

int uv_inet_pton(int af,char *src,void *dst)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong *puVar8;
  char *__dest;
  ushort *dst_00;
  char cVar9;
  bool bVar10;
  uchar tmp_1 [16];
  char tmp [46];
  ulong local_a8;
  long local_a0;
  ushort *local_98;
  char *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 *local_70;
  char local_68 [56];
  
  puVar8 = &local_a8;
  iVar2 = -0x16;
  if (dst != (void *)0x0 && src != (char *)0x0) {
    if (af == 10) {
      pcVar3 = strchr(src,0x25);
      __dest = src;
      if (pcVar3 != (char *)0x0) {
        iVar2 = (int)pcVar3 - (int)src;
        if (0x2d < iVar2) {
          return -0x16;
        }
        __dest = local_68;
        memcpy(__dest,src,(long)iVar2);
        local_68[iVar2] = '\0';
      }
      local_88 = 0;
      uStack_80 = 0;
      cVar9 = *__dest;
      iVar2 = -0x16;
      if (cVar9 != '\0') {
        if (cVar9 == ':') {
          if (__dest[1] != ':') {
            return -0x16;
          }
          __dest = __dest + 1;
          cVar9 = ':';
        }
        local_a8 = 0;
        iVar2 = 0;
        local_a0 = 0;
        local_98 = (ushort *)0x0;
        local_90 = __dest;
        local_70 = (undefined8 *)dst;
        do {
          __dest = __dest + 1;
          dst_00 = (ushort *)((long)puVar8 + 0x20);
          pvVar4 = memchr("0123456789abcdef",(int)cVar9,0x11);
          if (pvVar4 == (void *)0x0) {
            pvVar4 = memchr("0123456789ABCDEF",(int)cVar9,0x11);
            if (pvVar4 != (void *)0x0) {
              iVar5 = 0x282e40;
              goto LAB_00253d47;
            }
            if (cVar9 != ':') {
              if (cVar9 != '.') {
                return -0x16;
              }
              if (0xc < local_a0) {
                return -0x16;
              }
              iVar2 = inet_pton4(local_90,(uchar *)dst_00);
              if (iVar2 != 0) {
                return -0x16;
              }
              local_a0 = local_a0 + 4;
              goto LAB_00253e3c;
            }
            local_90 = __dest;
            if (iVar2 == 0) {
              iVar2 = 0;
              bVar10 = local_98 != (ushort *)0x0;
              local_98 = dst_00;
              if (bVar10) {
                return -0x16;
              }
            }
            else {
              if (*__dest == '\0') {
                return -0x16;
              }
              if (0xe < local_a0) {
                return -0x16;
              }
              local_a0 = local_a0 + 2;
              *dst_00 = (ushort)local_a8 << 8 | (ushort)local_a8 >> 8;
              iVar2 = 0;
              local_a8 = 0;
            }
          }
          else {
            iVar5 = 0x282e20;
LAB_00253d47:
            if (3 < iVar2) {
              return -0x16;
            }
            local_a8 = (ulong)(uint)((int)pvVar4 - iVar5 | (int)local_a8 << 4);
            iVar2 = iVar2 + 1;
          }
          puVar8 = (ulong *)((long)&local_a8 + local_a0);
          cVar9 = *__dest;
        } while (cVar9 != '\0');
        if (iVar2 != 0) {
          if (0xe < local_a0) {
            return -0x16;
          }
          *(ushort *)((long)&local_88 + local_a0) = (ushort)local_a8 << 8 | (ushort)local_a8 >> 8;
          local_a0 = local_a0 + 2;
        }
LAB_00253e3c:
        if (local_98 == (ushort *)0x0) {
          if (local_a0 != 0x10) {
            return -0x16;
          }
        }
        else {
          if (local_a0 == 0x10) {
            return -0x16;
          }
          uVar6 = ((int)&local_a8 + (int)local_a0 + 0x20) - (int)local_98;
          if (0 < (int)uVar6) {
            lVar1 = (ulong)(uVar6 & 0x7fffffff) - 1;
            lVar7 = 0;
            do {
              *(undefined1 *)((long)&uStack_80 + lVar7 + 7) =
                   *(undefined1 *)((long)local_98 + lVar7 + lVar1);
              *(undefined1 *)((long)local_98 + lVar7 + lVar1) = 0;
              lVar7 = lVar7 + -1;
            } while (1 - (ulong)(uVar6 + 1) != lVar7);
          }
        }
        *local_70 = local_88;
        local_70[1] = uStack_80;
        iVar2 = 0;
      }
    }
    else {
      iVar2 = -0x61;
      if (af == 2) {
        iVar2 = inet_pton4(src,(uchar *)dst);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int uv_inet_pton(int af, const char* src, void* dst) {
  if (src == NULL || dst == NULL)
    return UV_EINVAL;

  switch (af) {
  case AF_INET:
    return (inet_pton4(src, dst));
  case AF_INET6: {
    int len;
    char tmp[UV__INET6_ADDRSTRLEN], *s, *p;
    s = (char*) src;
    p = strchr(src, '%');
    if (p != NULL) {
      s = tmp;
      len = p - src;
      if (len > UV__INET6_ADDRSTRLEN-1)
        return UV_EINVAL;
      memcpy(s, src, len);
      s[len] = '\0';
    }
    return inet_pton6(s, dst);
  }
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}